

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# characterhash.h
# Opt level: O3

void __thiscall
CharacterHash<unsigned_int,_unsigned_char>::CharacterHash
          (CharacterHash<unsigned_int,_unsigned_char> *this,uint maxval)

{
  uint32 uVar1;
  size_t k;
  long lVar2;
  mersenneRNG randomgenerator;
  uint32 local_13c8;
  MTRand local_13c0;
  uint local_30;
  
  MTRand::seed(&local_13c0);
  lVar2 = 0;
  local_30 = maxval;
  do {
    local_13c8 = (uint32)(int)local_30;
    uVar1 = MTRand::randInt(&local_13c0,&local_13c8);
    this->hashvalues[lVar2] = (uint)uVar1;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x100);
  return;
}

Assistant:

CharacterHash(hashvaluetype maxval) {
    if (sizeof(hashvaluetype) <= 4) {
      mersenneRNG randomgenerator(maxval);
      for (size_t k = 0; k < nbrofchars; ++k)
        hashvalues[k] = static_cast<hashvaluetype>(randomgenerator());
    } else if (sizeof(hashvaluetype) == 8) {
      mersenneRNG randomgenerator(maxval >> 32);
      mersenneRNG randomgeneratorbase((maxval >> 32) == 0 ? maxval
                                                          : 0xFFFFFFFFU);
      for (size_t k = 0; k < nbrofchars; ++k)
        hashvalues[k] = static_cast<hashvaluetype>(randomgeneratorbase()) |
                        (static_cast<hashvaluetype>(randomgenerator()) << 32);
    } else
      throw runtime_error("unsupported hash value type");
  }